

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWGenerator.cxx
# Opt level: O0

string * __thiscall
cmCPackIFWGenerator::GetComponentInstallDirNameSuffix
          (string *__return_storage_ptr__,cmCPackIFWGenerator *this,string *componentName)

{
  mapped_type *component;
  string local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  undefined4 local_104;
  string local_100;
  cmAlphaNum local_e0;
  cmAlphaNum local_b0;
  allocator<char> local_79;
  undefined1 local_78 [8];
  string suffix;
  allocator<char> local_41;
  undefined1 local_40 [8];
  string prefix;
  string *componentName_local;
  cmCPackIFWGenerator *this_local;
  
  prefix.field_2._8_8_ = componentName;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_40,"packages/",&local_41);
  std::allocator<char>::~allocator(&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_78,"/data",&local_79);
  std::allocator<char>::~allocator(&local_79);
  if ((this->super_cmCPackGenerator).componentPackageMethod == ONE_PACKAGE) {
    cmAlphaNum::cmAlphaNum(&local_b0,(string *)local_40);
    GetRootPackageName_abi_cxx11_(&local_100,this);
    cmAlphaNum::cmAlphaNum(&local_e0,&local_100);
    cmStrCat<std::__cxx11::string>
              (__return_storage_ptr__,&local_b0,&local_e0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78);
    std::__cxx11::string::~string((string *)&local_100);
  }
  else {
    component = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>_>
                ::operator[](&(this->super_cmCPackGenerator).Components,
                             (key_type *)prefix.field_2._8_8_);
    GetComponentPackageName_abi_cxx11_(&local_148,this,component);
    std::operator+(&local_128,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                   &local_148);
    std::operator+(__return_storage_ptr__,&local_128,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)&local_148);
  }
  local_104 = 1;
  std::__cxx11::string::~string((string *)local_78);
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCPackIFWGenerator::GetComponentInstallDirNameSuffix(
  const std::string& componentName)
{
  const std::string prefix = "packages/";
  const std::string suffix = "/data";

  if (this->componentPackageMethod == this->ONE_PACKAGE) {
    return cmStrCat(prefix, this->GetRootPackageName(), suffix);
  }

  return prefix +
    this->GetComponentPackageName(&this->Components[componentName]) + suffix;
}